

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tick.cpp
# Opt level: O1

Tick Js::Tick::FromMicroseconds(uint64 luTime)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  code *pcVar3;
  bool bVar4;
  uint64 in_RAX;
  undefined4 *puVar5;
  Tick local_28;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = luTime;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = s_luFreq;
  local_28.m_luTick = in_RAX;
  if (SUB168(auVar1 * auVar2,8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Tick.cpp"
                                ,0x4d,"(luTime <= luMaxTick)",
                                "Ensure time can be converted losslessly");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  Tick(&local_28,(luTime * s_luFreq) / 1000000);
  return (Tick)local_28.m_luTick;
}

Assistant:

Tick
    Tick::FromMicroseconds(
        uint64 luTime)                          // Time, in microseconds
    {
        //
        // Ensure we can convert losslessly.
        //

#if DBG
        const uint64 luMaxTick = _UI64_MAX / s_luFreq;
        AssertMsg(luTime <= luMaxTick, "Ensure time can be converted losslessly");
#endif // DBG


        //
        // Create the Tick
        //

        uint64 luTick = luTime * s_luFreq / ((uint64) 1000000);
        return Tick(luTick);
    }